

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# natpmp.cpp
# Opt level: O3

error_code libtorrent::natpmp::from_result_code(int version,int result)

{
  uint uVar1;
  ulong uVar2;
  error_code eVar3;
  
  uVar2 = (ulong)(uint)result;
  if ((version == 0) && (result - 3U < 3)) {
    uVar2 = (ulong)*(uint *)(&DAT_003df8d8 + (ulong)(result - 3U) * 4);
  }
  if ((pcp_category::pcp_category.super_error_category.id_ == 0xb2ab117a257edf0d) ||
     (pcp_category::pcp_category.super_error_category.id_ == 0x8fafd21e25c5e09b)) {
    uVar1 = (uint)((int)uVar2 != 0);
  }
  else {
    uVar1 = (*pcp_category::pcp_category.super_error_category._vptr_error_category[6])
                      (&pcp_category::pcp_category,uVar2);
  }
  eVar3._0_8_ = uVar2 | (ulong)(uVar1 & 0xff) << 0x20;
  eVar3.cat_ = &pcp_category::pcp_category.super_error_category;
  return eVar3;
}

Assistant:

error_code natpmp::from_result_code(int const version, int result)
{
	if (version == version_natpmp)
	{
		// a few nat-pmp result codes map to different codes
		// in pcp
		switch (result)
		{
		case 3:result = 7; break;
		case 4:result = 8; break;
		case 5:result = 4; break;
		}
	}
	return errors::pcp_errors(result);
}